

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::pop_rr<(SM83::Registers)10>(SM83 *this)

{
  u16 *word_reg;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>_>
  fmt;
  anon_union_2_2_fd64ea96_for_SM83_2 *args_6;
  string_view local_30;
  v11 *local_20;
  char *local_18;
  SM83 *local_10;
  SM83 *this_local;
  
  local_20 = (v11 *)0x15b5f5;
  local_18 = (char *)0x44;
  args_6 = &this->field_1;
  local_10 = this;
  local_30 = Get16bitRegisterName<(SM83::Registers)10>(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = local_18;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>>
            (local_20,fmt,&args_6->bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&local_30,
             (basic_string_view<char,_std::char_traits<char>_> *)&args_6->field_1);
  word_reg = Get16bitRegisterPointer<(SM83::Registers)10>(this);
  StackPop(this,word_reg);
  return;
}

Assistant:

void SM83::pop_rr() {
    LTRACE("POP {}", Get16bitRegisterName<Register>());
    StackPop(Get16bitRegisterPointer<Register>());

    if constexpr (Register == Registers::AF) {
        // Lowest 4 bits are always 0
        f &= ~0x0F;
    }
}